

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestHugeFieldNumbersLite::ByteSizeLong(TestHugeFieldNumbersLite *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  ForeignEnumLite value;
  OneofFieldCase OVar5;
  uint32_t value_00;
  size_t sVar6;
  RepeatedField<int> *pRVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  reference key;
  uint32_t *puVar12;
  string *psVar13;
  long lVar14;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestHugeFieldNumbersLite *this_;
  TestHugeFieldNumbersLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sVar6 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar7 = _internal_repeated_int32(this);
  sVar8 = google::protobuf::internal::WireFormatLite::Int32Size(pRVar7);
  iVar3 = _internal_repeated_int32_size(this);
  sVar9 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar7 = _internal_packed_int32(this);
  sVar10 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (pRVar7,5,&(this->field_0)._impl_._packed_int32_cached_byte_size_);
  iVar3 = _internal_string_string_map_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar11 * 5 + sVar10 + sVar9 * 5 + sVar8 + sVar6;
  this_00 = _internal_string_string_map_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::begin((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,this_00);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end((const_iterator *)&entry,this_00);
  while (bVar2 = google::protobuf::operator!=
                           ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,
                            (const_iterator *)&entry), bVar2) {
    key = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator*
                    ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    sVar6 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong(&key->first,&key->second);
    sStack_58 = sVar6 + sStack_58;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::const_iterator::operator++((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  puVar12 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar12;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar13 = _internal_optional_string_abi_cxx11_(this);
      sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar13);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar13 = _internal_optional_bytes_abi_cxx11_(this);
      sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar13);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ForeignMessageLite>
                        ((this->field_0)._impl_.optional_message_);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              GroupSize<proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup>
                        ((this->field_0)._impl_.optionalgroup_);
      sStack_58 = sVar6 + 10 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      iVar4 = _internal_optional_int32(this);
      sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar4 = _internal_fixed_32(this);
      sVar6 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      value = _internal_optional_enum(this);
      sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
  }
  OVar5 = oneof_field_case(this);
  if (OVar5 != ONEOF_FIELD_NOT_SET) {
    if (OVar5 == kOneofUint32) {
      value_00 = _internal_oneof_uint32(this);
      sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(value_00);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    else if (OVar5 == kOneofTestAllTypes) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestAllTypesLite>
                        ((this->field_0)._impl_.oneof_field_.oneof_test_all_types_);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    else if (OVar5 == kOneofString) {
      psVar13 = _internal_oneof_string_abi_cxx11_(this);
      sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar13);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
    else if (OVar5 == kOneofBytes) {
      psVar13 = _internal_oneof_bytes_abi_cxx11_(this);
      sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar13);
      sStack_58 = sVar6 + 5 + sStack_58;
    }
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar14 = std::__cxx11::string::size();
    sStack_58 = lVar14 + sStack_58;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar3);
  return sStack_58;
}

Assistant:

::size_t TestHugeFieldNumbersLite::ByteSizeLong() const {
  const TestHugeFieldNumbersLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 536870002;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{5} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int32 packed_int32 = 536870003 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 5,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // map<string, string> string_string_map = 536870010;
    {
      total_size +=
          5 * ::google::protobuf::internal::FromIntSize(this_._internal_string_string_map_size());
      for (const auto& entry : this_._internal_string_string_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, std::string,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_STRING>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // string optional_string = 536870005;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 536870006;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // .proto2_unittest.ForeignMessageLite optional_message = 536870007;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_message_);
    }
    // .proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup optionalgroup = 536870008 [features = {
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 10 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // int32 optional_int32 = 536870000;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_optional_int32());
    }
    // int32 fixed_32 = 536870001;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 5 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_fixed_32());
    }
    // .proto2_unittest.ForeignEnumLite optional_enum = 536870004;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 5 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 536870011;
    case kOneofUint32: {
      total_size += 5 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_unittest.TestAllTypesLite oneof_test_all_types = 536870012;
    case kOneofTestAllTypes: {
      total_size += 5 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_test_all_types_);
      break;
    }
    // string oneof_string = 536870013;
    case kOneofString: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 536870014;
    case kOneofBytes: {
      total_size += 5 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}